

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O0

void __thiscall addrman_tests::caddrinfo_get_new_bucket::test_method(caddrinfo_get_new_bucket *this)

{
  long lVar1;
  span<const_std::byte,_18446744073709551615UL> source;
  bool bVar2;
  undefined1 uVar3;
  CAddress *addrIn;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar4;
  char *in_stack_ffffffffffffef58;
  lazy_ostream *in_stack_ffffffffffffef60;
  char *in_stack_ffffffffffffef68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef70;
  undefined7 in_stack_ffffffffffffef78;
  undefined1 in_stack_ffffffffffffef7f;
  CService *in_stack_ffffffffffffef80;
  CAddress *in_stack_ffffffffffffef88;
  AddrInfo *pAVar5;
  undefined7 in_stack_ffffffffffffef90;
  undefined1 in_stack_ffffffffffffef97;
  _Rb_tree_const_iterator<int> in_stack_ffffffffffffef98;
  undefined4 in_stack_ffffffffffffefa0;
  int in_stack_ffffffffffffefa4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined7 in_stack_ffffffffffffefb0;
  undefined1 in_stack_ffffffffffffefb7;
  CAddress *in_stack_ffffffffffffefb8;
  AddrInfo *in_stack_ffffffffffffefc0;
  undefined7 in_stack_ffffffffffffefc8;
  undefined1 in_stack_ffffffffffffefcf;
  CNetAddr *in_stack_ffffffffffffefd0;
  undefined4 in_stack_ffffffffffffefd8;
  undefined4 in_stack_ffffffffffffefdc;
  AddrInfo *in_stack_ffffffffffffefe0;
  undefined7 in_stack_ffffffffffffefe8;
  undefined1 in_stack_ffffffffffffefef;
  _Rb_tree_const_iterator<int> in_stack_fffffffffffff040;
  uint16_t port;
  int j;
  caddrinfo_get_new_bucket *this_local;
  const_string local_ed8 [2];
  lazy_ostream local_eb8 [2];
  assertion_result local_e98 [2];
  int bucket_3;
  undefined1 local_e55;
  int p_1;
  const_string local_e50 [2];
  lazy_ostream local_e30 [2];
  assertion_result local_e10 [2];
  int bucket_2;
  allocator<char> local_dcd;
  int p;
  const_string local_dc8 [2];
  lazy_ostream local_da8 [2];
  assertion_result local_d88 [2];
  int bucket_1;
  allocator<char> local_d45;
  int local_d44;
  int local_d40;
  lazy_ostream local_d3c;
  undefined1 local_d20 [64];
  int bucket;
  int i;
  lazy_ostream local_cd8;
  undefined1 local_cc0 [64];
  const_string local_c80 [2];
  lazy_ostream local_c60 [5];
  assertion_result local_c10 [2];
  const_string local_bd8 [2];
  lazy_ostream local_bb8 [2];
  assertion_result local_b98 [2];
  lazy_ostream local_b60;
  undefined1 local_b48 [64];
  lazy_ostream local_b08;
  undefined1 local_af0 [68];
  undefined4 local_aac;
  undefined4 local_aa8;
  allocator<char> local_aa3;
  allocator<char> local_aa2;
  allocator<char> local_aa1 [17];
  _Base_ptr local_a90;
  undefined1 local_a88;
  _Base_ptr local_a80;
  undefined1 local_a78;
  _Base_ptr local_a70;
  undefined1 local_a68;
  _Base_ptr local_a60;
  undefined1 local_a58;
  NetGroupManager ngm_asmap;
  vector<bool,_std::allocator<bool>_> asmap;
  AddrInfo infoj_2;
  AddrInfo infoj_1;
  AddrInfo infoj;
  AddrInfo infoi;
  set<int,_std::less<int>,_std::allocator<int>_> buckets;
  AddrInfo info2;
  uint256 nKey2;
  uint256 nKey1;
  AddrInfo info1;
  CNetAddr source1;
  CAddress addr2;
  CAddress addr1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::span<const_std::byte,_18446744073709551615UL>::span<const_std::byte,_59UL>
            ((span<const_std::byte,_18446744073709551615UL> *)in_stack_ffffffffffffef68,
             (span<const_std::byte,_59UL> *)in_stack_ffffffffffffef60);
  source._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffefe8;
  source._M_ptr = (pointer)in_stack_ffffffffffffefe0;
  source._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffefef;
  FromBytes(source);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)
             CONCAT17(in_stack_ffffffffffffefb7,in_stack_ffffffffffffefb0),
             (vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffefa8);
  NetGroupManager::NetGroupManager
            ((NetGroupManager *)in_stack_ffffffffffffef58,
             (vector<bool,_std::allocator<bool>_> *)0x311ee8);
  std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffef58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffefa8,
             (char *)CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0),
             (allocator<char> *)in_stack_ffffffffffffef98._M_node);
  ResolveService(in_stack_ffffffffffffefa8,
                 (uint16_t)((ulong)in_stack_fffffffffffff040._M_node >> 0x30));
  CAddress::CAddress(in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
                     CONCAT17(in_stack_ffffffffffffef7f,in_stack_ffffffffffffef78));
  CService::~CService((CService *)in_stack_ffffffffffffef58);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffef58);
  std::allocator<char>::~allocator(local_aa1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffefa8,
             (char *)CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0),
             (allocator<char> *)in_stack_ffffffffffffef98._M_node);
  ResolveService(in_stack_ffffffffffffefa8,
                 (uint16_t)((ulong)in_stack_fffffffffffff040._M_node >> 0x30));
  CAddress::CAddress(in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
                     CONCAT17(in_stack_ffffffffffffef7f,in_stack_ffffffffffffef78));
  CService::~CService((CService *)in_stack_ffffffffffffef58);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffef58);
  std::allocator<char>::~allocator(&local_aa2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffefa8,
             (char *)CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0),
             (allocator<char> *)in_stack_ffffffffffffef98._M_node);
  ResolveIP((string *)CONCAT17(in_stack_ffffffffffffefb7,in_stack_ffffffffffffefb0));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffef58);
  std::allocator<char>::~allocator(&local_aa3);
  AddrInfo::AddrInfo(in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8,
                     (CNetAddr *)CONCAT17(in_stack_ffffffffffffefb7,in_stack_ffffffffffffefb0));
  HashWriter::HashWriter((HashWriter *)in_stack_ffffffffffffef58);
  local_aa8 = 1;
  HashWriter::operator<<((HashWriter *)in_stack_ffffffffffffef68,(int *)in_stack_ffffffffffffef60);
  HashWriter::GetHash((HashWriter *)CONCAT17(in_stack_ffffffffffffef7f,in_stack_ffffffffffffef78));
  HashWriter::HashWriter((HashWriter *)in_stack_ffffffffffffef58);
  local_aac = 2;
  HashWriter::operator<<((HashWriter *)in_stack_ffffffffffffef68,(int *)in_stack_ffffffffffffef60);
  HashWriter::GetHash((HashWriter *)CONCAT17(in_stack_ffffffffffffef7f,in_stack_ffffffffffffef78));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef98._M_node,
               (const_string *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90),
               (size_t)in_stack_ffffffffffffef88,(const_string *)in_stack_ffffffffffffef80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffef60,(char (*) [1])in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    local_b08._vptr_lazy_ostream._4_4_ =
         AddrInfo::GetNewBucket
                   ((AddrInfo *)in_stack_ffffffffffffef68,(uint256 *)in_stack_ffffffffffffef60,
                    (NetGroupManager *)in_stack_ffffffffffffef58);
    local_b08._vptr_lazy_ostream._0_4_ = 0x31b;
    in_stack_ffffffffffffef68 = "795";
    in_stack_ffffffffffffef60 = &local_b08;
    in_stack_ffffffffffffef58 = "info1.GetNewBucket(nKey1, ngm_asmap)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_af0,&local_b08.m_empty,0x28c,1,2,
               (undefined1 *)((long)&local_b08._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef98._M_node,
               (const_string *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90),
               (size_t)in_stack_ffffffffffffef88,(const_string *)in_stack_ffffffffffffef80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffef60,(char (*) [1])in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    local_b60._vptr_lazy_ostream._4_4_ =
         AddrInfo::GetNewBucket
                   (in_stack_ffffffffffffefe0,
                    (uint256 *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8),
                    in_stack_ffffffffffffefd0,
                    (NetGroupManager *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8)
                   );
    local_b60._vptr_lazy_ostream._0_4_ = 0x31b;
    in_stack_ffffffffffffef68 = "795";
    in_stack_ffffffffffffef60 = &local_b60;
    in_stack_ffffffffffffef58 = "info1.GetNewBucket(nKey1, source1, ngm_asmap)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_b48,&local_b60.m_empty,0x28d,1,2,
               (undefined1 *)((long)&local_b60._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef98._M_node,
               (const_string *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90),
               (size_t)in_stack_ffffffffffffef88,(const_string *)in_stack_ffffffffffffef80);
    AddrInfo::GetNewBucket
              ((AddrInfo *)in_stack_ffffffffffffef68,(uint256 *)in_stack_ffffffffffffef60,
               (NetGroupManager *)in_stack_ffffffffffffef58);
    AddrInfo::GetNewBucket
              ((AddrInfo *)in_stack_ffffffffffffef68,(uint256 *)in_stack_ffffffffffffef60,
               (NetGroupManager *)in_stack_ffffffffffffef58);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef68,
               SUB81((ulong)in_stack_ffffffffffffef60 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffef60,(basic_cstring<const_char> *)in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    in_stack_ffffffffffffef58 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b98,local_bb8,local_bd8,0x291,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  AddrInfo::AddrInfo(in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8,
                     (CNetAddr *)CONCAT17(in_stack_ffffffffffffefb7,in_stack_ffffffffffffefb0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef98._M_node,
               (const_string *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90),
               (size_t)in_stack_ffffffffffffef88,(const_string *)in_stack_ffffffffffffef80);
    CService::GetKey(&in_stack_ffffffffffffef88->super_CService);
    CService::GetKey(&in_stack_ffffffffffffef88->super_CService);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_ffffffffffffef88,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_ffffffffffffef80);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef68,
               SUB81((ulong)in_stack_ffffffffffffef60 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffef60,(basic_cstring<const_char> *)in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    in_stack_ffffffffffffef58 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c10,local_c60,local_c80,0x295,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef58);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffef68);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffef68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef98._M_node,
               (const_string *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90),
               (size_t)in_stack_ffffffffffffef88,(const_string *)in_stack_ffffffffffffef80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffef60,(char (*) [1])in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    local_cd8._vptr_lazy_ostream._4_4_ =
         AddrInfo::GetNewBucket
                   ((AddrInfo *)in_stack_ffffffffffffef68,(uint256 *)in_stack_ffffffffffffef60,
                    (NetGroupManager *)in_stack_ffffffffffffef58);
    local_cd8._vptr_lazy_ostream._0_4_ =
         AddrInfo::GetNewBucket
                   ((AddrInfo *)in_stack_ffffffffffffef68,(uint256 *)in_stack_ffffffffffffef60,
                    (NetGroupManager *)in_stack_ffffffffffffef58);
    in_stack_ffffffffffffef68 = "info2.GetNewBucket(nKey1, ngm_asmap)";
    in_stack_ffffffffffffef60 = &local_cd8;
    in_stack_ffffffffffffef58 = "info1.GetNewBucket(nKey1, ngm_asmap)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_cc0,&local_cd8.m_empty,0x296,1,2,
               (undefined1 *)((long)&local_cd8._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffef58);
  for (i = 0; port = (uint16_t)((ulong)in_stack_fffffffffffff040._M_node >> 0x30), i < 0xff;
      i = i + 1) {
    util::ToString<int>((int *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90));
    std::operator+((char *)in_stack_ffffffffffffef70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffef68);
    ResolveService(in_stack_ffffffffffffefa8,port);
    CAddress::CAddress(in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
                       CONCAT17(in_stack_ffffffffffffef7f,in_stack_ffffffffffffef78));
    util::ToString<int>((int *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90));
    std::operator+((char *)in_stack_ffffffffffffef70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffef68);
    ResolveIP((string *)CONCAT17(in_stack_ffffffffffffefb7,in_stack_ffffffffffffefb0));
    AddrInfo::AddrInfo(in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8,
                       (CNetAddr *)CONCAT17(in_stack_ffffffffffffefb7,in_stack_ffffffffffffefb0));
    CNetAddr::~CNetAddr((CNetAddr *)in_stack_ffffffffffffef58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef58);
    CAddress::~CAddress((CAddress *)in_stack_ffffffffffffef58);
    CService::~CService((CService *)in_stack_ffffffffffffef58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef58);
    bucket = AddrInfo::GetNewBucket
                       ((AddrInfo *)in_stack_ffffffffffffef68,(uint256 *)in_stack_ffffffffffffef60,
                        (NetGroupManager *)in_stack_ffffffffffffef58);
    pVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffef68,
                       (value_type_conflict2 *)in_stack_ffffffffffffef60);
    in_stack_fffffffffffff040 = pVar4.first._M_node;
    local_a58 = pVar4.second;
    local_a60 = in_stack_fffffffffffff040._M_node;
    AddrInfo::~AddrInfo((AddrInfo *)in_stack_ffffffffffffef58);
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef98._M_node,
               (const_string *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90),
               (size_t)in_stack_ffffffffffffef88,(const_string *)in_stack_ffffffffffffef80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffef60,(char (*) [1])in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    local_d3c._4_8_ =
         std::set<int,_std::less<int>,_std::allocator<int>_>::size
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffef58);
    local_d3c._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffef68 = "1U";
    in_stack_ffffffffffffef60 = &local_d3c;
    in_stack_ffffffffffffef58 = "buckets.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_d20,&local_d3c.field_0xc,0x2a2,1,2,
               (undefined1 *)((long)&local_d3c._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::set<int,_std::less<int>,_std::allocator<int>_>::clear
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffef58);
  for (j = 0; j < 0x3fc; j = j + 1) {
    local_d40 = j / 0xff + 0xfa;
    util::ToString<int>((int *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90));
    std::operator+(in_stack_ffffffffffffef70,in_stack_ffffffffffffef68);
    local_d44 = j % 0x100;
    util::ToString<int>((int *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffef88);
    std::operator+(in_stack_ffffffffffffef70,in_stack_ffffffffffffef68);
    ResolveService(in_stack_ffffffffffffefa8,
                   (uint16_t)((ulong)in_stack_fffffffffffff040._M_node >> 0x30));
    CAddress::CAddress(in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
                       CONCAT17(in_stack_ffffffffffffef7f,in_stack_ffffffffffffef78));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffefa8,
               (char *)CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0),
               (allocator<char> *)in_stack_ffffffffffffef98._M_node);
    ResolveIP((string *)CONCAT17(in_stack_ffffffffffffefb7,in_stack_ffffffffffffefb0));
    AddrInfo::AddrInfo(in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8,
                       (CNetAddr *)CONCAT17(in_stack_ffffffffffffefb7,in_stack_ffffffffffffefb0));
    CNetAddr::~CNetAddr((CNetAddr *)in_stack_ffffffffffffef58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef58);
    std::allocator<char>::~allocator(&local_d45);
    CAddress::~CAddress((CAddress *)in_stack_ffffffffffffef58);
    CService::~CService((CService *)in_stack_ffffffffffffef58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef58);
    bucket_1 = AddrInfo::GetNewBucket
                         ((AddrInfo *)in_stack_ffffffffffffef68,(uint256 *)in_stack_ffffffffffffef60
                          ,(NetGroupManager *)in_stack_ffffffffffffef58);
    pVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffef68,
                       (value_type_conflict2 *)in_stack_ffffffffffffef60);
    local_a70 = (_Base_ptr)pVar4.first._M_node;
    local_a68 = pVar4.second;
    AddrInfo::~AddrInfo((AddrInfo *)in_stack_ffffffffffffef58);
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef98._M_node,
               (const_string *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90),
               (size_t)in_stack_ffffffffffffef88,(const_string *)in_stack_ffffffffffffef80);
    std::set<int,_std::less<int>,_std::allocator<int>_>::size
              ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffef58);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef68,
               SUB81((ulong)in_stack_ffffffffffffef60 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffef60,(basic_cstring<const_char> *)in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    in_stack_ffffffffffffef58 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d88,local_da8,local_dc8,0x2af,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::set<int,_std::less<int>,_std::allocator<int>_>::clear
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffef58);
  for (p = 0; p < 0xff; p = p + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffefa8,
               (char *)CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0),
               (allocator<char> *)in_stack_ffffffffffffef98._M_node);
    ResolveService(in_stack_ffffffffffffefa8,
                   (uint16_t)((ulong)in_stack_fffffffffffff040._M_node >> 0x30));
    CAddress::CAddress(in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
                       CONCAT17(in_stack_ffffffffffffef7f,in_stack_ffffffffffffef78));
    util::ToString<int>((int *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90));
    std::operator+((char *)in_stack_ffffffffffffef70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffef68);
    std::operator+(in_stack_ffffffffffffef70,in_stack_ffffffffffffef68);
    ResolveIP((string *)CONCAT17(in_stack_ffffffffffffefb7,in_stack_ffffffffffffefb0));
    AddrInfo::AddrInfo(in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8,
                       (CNetAddr *)CONCAT17(in_stack_ffffffffffffefb7,in_stack_ffffffffffffefb0));
    CNetAddr::~CNetAddr((CNetAddr *)in_stack_ffffffffffffef58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef58);
    CAddress::~CAddress((CAddress *)in_stack_ffffffffffffef58);
    CService::~CService((CService *)in_stack_ffffffffffffef58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef58);
    std::allocator<char>::~allocator(&local_dcd);
    bucket_2 = AddrInfo::GetNewBucket
                         ((AddrInfo *)in_stack_ffffffffffffef68,(uint256 *)in_stack_ffffffffffffef60
                          ,(NetGroupManager *)in_stack_ffffffffffffef58);
    pVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffef68,
                       (value_type_conflict2 *)in_stack_ffffffffffffef60);
    local_a80 = (_Base_ptr)pVar4.first._M_node;
    local_a78 = pVar4.second;
    AddrInfo::~AddrInfo((AddrInfo *)in_stack_ffffffffffffef58);
  }
  do {
    pAVar5 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef98._M_node,
               (const_string *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90),
               (size_t)in_stack_ffffffffffffef88,(const_string *)in_stack_ffffffffffffef80);
    std::set<int,_std::less<int>,_std::allocator<int>_>::size
              ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffef58);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef68,
               SUB81((ulong)in_stack_ffffffffffffef60 >> 0x38,0));
    addrIn = (CAddress *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffef60,(basic_cstring<const_char> *)in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    in_stack_ffffffffffffef58 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e10,local_e30,local_e50,699,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef58);
    uVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar3);
  std::set<int,_std::less<int>,_std::allocator<int>_>::clear
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffef58);
  for (p_1 = 0; p_1 < 0xff; p_1 = p_1 + 1) {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e55;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0),
               (allocator<char> *)in_stack_ffffffffffffef98._M_node);
    ResolveService(this_00,(uint16_t)((ulong)in_stack_fffffffffffff040._M_node >> 0x30));
    CAddress::CAddress(in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
                       CONCAT17(in_stack_ffffffffffffef7f,in_stack_ffffffffffffef78));
    util::ToString<int>((int *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90));
    std::operator+((char *)in_stack_ffffffffffffef70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffef68);
    std::operator+(in_stack_ffffffffffffef70,in_stack_ffffffffffffef68);
    ResolveIP((string *)CONCAT17(uVar3,in_stack_ffffffffffffefb0));
    AddrInfo::AddrInfo(pAVar5,addrIn,(CNetAddr *)CONCAT17(uVar3,in_stack_ffffffffffffefb0));
    CNetAddr::~CNetAddr((CNetAddr *)in_stack_ffffffffffffef58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef58);
    CAddress::~CAddress((CAddress *)in_stack_ffffffffffffef58);
    CService::~CService((CService *)in_stack_ffffffffffffef58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef58);
    std::allocator<char>::~allocator((allocator<char> *)&local_e55);
    in_stack_ffffffffffffefa4 =
         AddrInfo::GetNewBucket
                   ((AddrInfo *)in_stack_ffffffffffffef68,(uint256 *)in_stack_ffffffffffffef60,
                    (NetGroupManager *)in_stack_ffffffffffffef58);
    bucket_3 = in_stack_ffffffffffffefa4;
    pVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffef68,
                       (value_type_conflict2 *)in_stack_ffffffffffffef60);
    in_stack_ffffffffffffef98 = pVar4.first._M_node;
    in_stack_ffffffffffffef97 = pVar4.second;
    local_a90 = in_stack_ffffffffffffef98._M_node;
    local_a88 = in_stack_ffffffffffffef97;
    AddrInfo::~AddrInfo((AddrInfo *)in_stack_ffffffffffffef58);
  }
  do {
    pAVar5 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef98._M_node,
               (const_string *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90),
               (size_t)pAVar5,(const_string *)in_stack_ffffffffffffef80);
    std::set<int,_std::less<int>,_std::allocator<int>_>::size
              ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffef58);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef68,
               SUB81((ulong)in_stack_ffffffffffffef60 >> 0x38,0));
    in_stack_ffffffffffffef80 = (CService *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffef60,(basic_cstring<const_char> *)in_stack_ffffffffffffef58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef68,
               (pointer)in_stack_ffffffffffffef60,(unsigned_long)in_stack_ffffffffffffef58);
    in_stack_ffffffffffffef58 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e98,local_eb8,local_ed8,0x2c7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffef58);
  AddrInfo::~AddrInfo((AddrInfo *)in_stack_ffffffffffffef58);
  AddrInfo::~AddrInfo((AddrInfo *)in_stack_ffffffffffffef58);
  CNetAddr::~CNetAddr((CNetAddr *)in_stack_ffffffffffffef58);
  CAddress::~CAddress((CAddress *)in_stack_ffffffffffffef58);
  CAddress::~CAddress((CAddress *)in_stack_ffffffffffffef58);
  NetGroupManager::~NetGroupManager((NetGroupManager *)in_stack_ffffffffffffef58);
  std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffef58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(caddrinfo_get_new_bucket)
{
    std::vector<bool> asmap = FromBytes(test::data::asmap);
    NetGroupManager ngm_asmap{asmap};

    CAddress addr1 = CAddress(ResolveService("250.1.2.1", 8333), NODE_NONE);
    CAddress addr2 = CAddress(ResolveService("250.1.2.1", 9999), NODE_NONE);

    CNetAddr source1 = ResolveIP("250.1.2.1");

    AddrInfo info1 = AddrInfo(addr1, source1);

    uint256 nKey1 = (HashWriter{} << 1).GetHash();
    uint256 nKey2 = (HashWriter{} << 2).GetHash();

    // Test: Make sure the buckets are what we expect
    BOOST_CHECK_EQUAL(info1.GetNewBucket(nKey1, ngm_asmap), 795);
    BOOST_CHECK_EQUAL(info1.GetNewBucket(nKey1, source1, ngm_asmap), 795);

    // Test: Make sure key actually randomizes bucket placement. A fail on
    //  this test could be a security issue.
    BOOST_CHECK(info1.GetNewBucket(nKey1, ngm_asmap) != info1.GetNewBucket(nKey2, ngm_asmap));

    // Test: Ports should not affect bucket placement in the addr
    AddrInfo info2 = AddrInfo(addr2, source1);
    BOOST_CHECK(info1.GetKey() != info2.GetKey());
    BOOST_CHECK_EQUAL(info1.GetNewBucket(nKey1, ngm_asmap), info2.GetNewBucket(nKey1, ngm_asmap));

    std::set<int> buckets;
    for (int i = 0; i < 255; i++) {
        AddrInfo infoi = AddrInfo(
            CAddress(ResolveService("250.1.1." + ToString(i)), NODE_NONE),
            ResolveIP("250.1.1." + ToString(i)));
        int bucket = infoi.GetNewBucket(nKey1, ngm_asmap);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the same /16 prefix
    // usually map to the same bucket.
    BOOST_CHECK_EQUAL(buckets.size(), 1U);

    buckets.clear();
    for (int j = 0; j < 4 * 255; j++) {
        AddrInfo infoj = AddrInfo(CAddress(
                                        ResolveService(
                                            ToString(250 + (j / 255)) + "." + ToString(j % 256) + ".1.1"), NODE_NONE),
            ResolveIP("251.4.1.1"));
        int bucket = infoj.GetNewBucket(nKey1, ngm_asmap);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the same source /16 prefix should not map to more
    // than 64 buckets.
    BOOST_CHECK(buckets.size() <= 64);

    buckets.clear();
    for (int p = 0; p < 255; p++) {
        AddrInfo infoj = AddrInfo(
            CAddress(ResolveService("250.1.1.1"), NODE_NONE),
            ResolveIP("101." + ToString(p) + ".1.1"));
        int bucket = infoj.GetNewBucket(nKey1, ngm_asmap);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the different source /16 prefixes usually map to MORE
    // than 1 bucket.
    BOOST_CHECK(buckets.size() > 1);

    buckets.clear();
    for (int p = 0; p < 255; p++) {
        AddrInfo infoj = AddrInfo(
            CAddress(ResolveService("250.1.1.1"), NODE_NONE),
            ResolveIP("250." + ToString(p) + ".1.1"));
        int bucket = infoj.GetNewBucket(nKey1, ngm_asmap);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the different source /16 prefixes sometimes map to NO MORE
    // than 1 bucket.
    BOOST_CHECK(buckets.size() == 1);
}